

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_brodnik.h
# Opt level: O3

void __thiscall
vector_brodnik<unsigned_char_*>::~vector_brodnik(vector_brodnik<unsigned_char_*> *this)

{
  bool bVar1;
  ulong uVar2;
  ulong uVar3;
  pointer pppuVar4;
  
  pppuVar4 = (this->_index_block).
             super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl.
             super__Vector_impl_data._M_start;
  if ((this->_index_block).super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>.
      _M_impl.super__Vector_impl_data._M_finish != pppuVar4) {
    uVar2 = 0;
    uVar3 = 1;
    do {
      free(pppuVar4[uVar2]);
      pppuVar4 = (this->_index_block).
                 super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl.
                 super__Vector_impl_data._M_start;
      bVar1 = uVar3 < (ulong)((long)(this->_index_block).
                                    super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)pppuVar4 >> 3
                             );
      uVar2 = uVar3;
      uVar3 = (ulong)((int)uVar3 + 1);
    } while (bVar1);
  }
  if (pppuVar4 != (pointer)0x0) {
    operator_delete(pppuVar4);
    return;
  }
  return;
}

Assistant:

~vector_brodnik()
	{
		for (unsigned i=0; i < _index_block.size(); ++i) {
			free(_index_block[i]);
		}
	}